

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

Dims * __thiscall adios2::VariableNT::Count(VariableNT *this)

{
  DataType DVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  DataType DVar6;
  long *in_RSI;
  string *in_RDI;
  DataType type;
  allocator *__rhs;
  allocator *__lhs;
  DataType commRank;
  DataType DVar7;
  string *component;
  string local_100 [32];
  string local_e0 [24];
  string *in_stack_ffffffffffffff38;
  VariableBase *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  DataType local_48;
  allocator local_31;
  string local_30 [48];
  
  component = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to VariableNT::Count",&local_31);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  DVar7 = *(DataType *)(*in_RSI + 0x28);
  local_48 = DVar7;
  DVar1 = helper::GetDataType<std::__cxx11::string>();
  if (DVar7 == DVar1) {
    adios2::core::Variable<std::__cxx11::string>::Count();
  }
  else {
    DVar1 = local_48;
    DVar2 = helper::GetDataType<char>();
    if (DVar1 == DVar2) {
      adios2::core::Variable<char>::Count();
    }
    else {
      DVar2 = local_48;
      DVar3 = helper::GetDataType<signed_char>();
      if (DVar2 == DVar3) {
        adios2::core::Variable<signed_char>::Count();
      }
      else {
        DVar3 = local_48;
        DVar4 = helper::GetDataType<short>();
        if (DVar3 == DVar4) {
          adios2::core::Variable<short>::Count();
        }
        else {
          commRank = local_48;
          DVar5 = helper::GetDataType<int>();
          DVar4 = local_48;
          if (commRank == DVar5) {
            adios2::core::Variable<int>::Count();
          }
          else {
            DVar6 = helper::GetDataType<long>();
            DVar5 = local_48;
            if (DVar4 == DVar6) {
              adios2::core::Variable<long>::Count();
            }
            else {
              DVar6 = helper::GetDataType<unsigned_char>();
              DVar4 = local_48;
              if (DVar5 == DVar6) {
                adios2::core::Variable<unsigned_char>::Count();
              }
              else {
                DVar6 = helper::GetDataType<unsigned_short>();
                DVar5 = local_48;
                if (DVar4 == DVar6) {
                  adios2::core::Variable<unsigned_short>::Count();
                }
                else {
                  DVar6 = helper::GetDataType<unsigned_int>();
                  DVar4 = local_48;
                  if (DVar5 == DVar6) {
                    adios2::core::Variable<unsigned_int>::Count();
                  }
                  else {
                    DVar6 = helper::GetDataType<unsigned_long>();
                    DVar5 = local_48;
                    if (DVar4 == DVar6) {
                      adios2::core::Variable<unsigned_long>::Count();
                    }
                    else {
                      DVar6 = helper::GetDataType<float>();
                      DVar4 = local_48;
                      if (DVar5 == DVar6) {
                        adios2::core::Variable<float>::Count();
                      }
                      else {
                        DVar6 = helper::GetDataType<double>();
                        DVar5 = local_48;
                        if (DVar4 == DVar6) {
                          adios2::core::Variable<double>::Count();
                        }
                        else {
                          DVar6 = helper::GetDataType<long_double>();
                          DVar4 = local_48;
                          if (DVar5 == DVar6) {
                            adios2::core::Variable<long_double>::Count();
                          }
                          else {
                            DVar6 = helper::GetDataType<std::complex<float>>();
                            DVar5 = local_48;
                            if (DVar4 == DVar6) {
                              adios2::core::Variable<std::complex<float>>::Count();
                            }
                            else {
                              DVar4 = helper::GetDataType<std::complex<double>>();
                              if (DVar5 == DVar4) {
                                adios2::core::Variable<std::complex<double>>::Count();
                              }
                              else if (local_48 == Struct) {
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           CONCAT44(DVar7,DVar1),
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           CONCAT44(DVar2,DVar3));
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_68,"bindings::CXX11",&local_69);
                                __lhs = &local_91;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_90,"VariableNT",__lhs);
                                __rhs = (allocator *)&stack0xffffffffffffff47;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_b8,"Count",__rhs);
                                adios2::ToString_abi_cxx11_((DataType)local_100);
                                std::operator+((char *)__lhs,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)__rhs);
                                helper::Throw<std::runtime_error>
                                          (component,in_RDI,(string *)CONCAT44(DVar7,DVar1),
                                           (string *)CONCAT44(DVar2,DVar3),commRank);
                                std::__cxx11::string::~string(local_e0);
                                std::__cxx11::string::~string(local_100);
                                std::__cxx11::string::~string(local_b8);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)&stack0xffffffffffffff47);
                                std::__cxx11::string::~string(local_90);
                                std::allocator<char>::~allocator((allocator<char> *)&local_91);
                                std::__cxx11::string::~string(local_68);
                                std::allocator<char>::~allocator((allocator<char> *)&local_69);
                                memset(in_RDI,0,0x18);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x35f5a9);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Dims *)component;
}

Assistant:

Dims VariableNT::Count() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::Count");
    auto type = m_Variable->m_Type;
#define declare_type(T)                                                                            \
    if (type == helper::GetDataType<T>())                                                          \
    {                                                                                              \
        return reinterpret_cast<core::Variable<T> *>(m_Variable)->Count();                         \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (type == DataType::Struct)
    {
        return reinterpret_cast<core::VariableStruct *>(m_Variable)->m_Count;
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "Count",
                                      "invalid data type " + ToString(type));
    return Dims();
}